

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O0

int Msat_SolverEnqueue(Msat_Solver_t *p,Msat_Lit_t Lit,Msat_Clause_t *pC)

{
  int i;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Msat_Var_t Var;
  Msat_Clause_t *pC_local;
  Msat_Lit_t Lit_local;
  Msat_Solver_t *p_local;
  
  i = Lit >> 1;
  iVar1 = Msat_IntVecReadEntry(p->vVarsUsed,i);
  if (iVar1 == 0) {
    p_local._4_4_ = 1;
  }
  else if (p->pAssigns[i] == -1) {
    if (p->fVerbose != 0) {
      iVar1 = Msat_SolverReadDecisionLevel(p);
      uVar2 = Msat_SolverReadDecisionLevel(p);
      pcVar3 = "";
      if ((Lit & 1U) != 0) {
        pcVar3 = "-";
      }
      printf("%-*dbind(%s%d)  ",(ulong)(iVar1 * 3 + 3),(ulong)uVar2,pcVar3,(ulong)(i + 1));
      Msat_ClausePrintSymbols(pC);
    }
    p->pAssigns[i] = Lit;
    iVar1 = Msat_IntVecReadSize(p->vTrailLim);
    p->pLevel[i] = iVar1;
    p->pReasons[i] = pC;
    Msat_IntVecPush(p->vTrail,Lit);
    Msat_QueueInsert(p->pQueue,Lit);
    Msat_OrderVarAssigned(p->pOrder,i);
    p_local._4_4_ = 1;
  }
  else {
    p_local._4_4_ = (uint)(p->pAssigns[i] == Lit);
  }
  return p_local._4_4_;
}

Assistant:

int  Msat_SolverEnqueue( Msat_Solver_t * p, Msat_Lit_t Lit, Msat_Clause_t * pC )
{
    Msat_Var_t Var = MSAT_LIT2VAR(Lit);

    // skip literals that are not in the current cone
    if ( !Msat_IntVecReadEntry( p->vVarsUsed, Var ) )
        return 1;

//    assert( Msat_QueueReadSize(p->pQueue) == Msat_IntVecReadSize(p->vTrail) );
    // if the literal is assigned
    // return 1 if the assignment is consistent
    // return 0 if the assignment is inconsistent (conflict)
    if ( p->pAssigns[Var] != MSAT_VAR_UNASSIGNED )
        return p->pAssigns[Var] == Lit;
    // new fact - store it
    if ( p->fVerbose )
    {
//        printf(L_IND"bind("L_LIT")\n", L_ind, L_lit(Lit));
        printf(L_IND"bind("L_LIT")  ", L_ind, L_lit(Lit));
        Msat_ClausePrintSymbols( pC );
    }
    p->pAssigns[Var] = Lit;
    p->pLevel[Var]   = Msat_IntVecReadSize(p->vTrailLim);
//    p->pReasons[Var] = p->pLevel[Var]? pC: NULL;
    p->pReasons[Var] = pC;
    Msat_IntVecPush( p->vTrail, Lit );
    Msat_QueueInsert( p->pQueue, Lit );

    Msat_OrderVarAssigned( p->pOrder, Var );
    return 1;
}